

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderReturnTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::ShaderReturnCase::ShaderReturnCase
          (ShaderReturnCase *this,Context *context,char *name,char *description,bool isVertexCase,
          char *shaderSource,ShaderEvalFunc evalFunc,deUint32 requirements)

{
  long lVar1;
  undefined7 in_register_00000081;
  
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,context->m_testCtx,context->m_renderCtx,
             context->m_contextInfo,name,description,isVertexCase,evalFunc);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderReturnCase_01e1aa40;
  this->m_requirements = requirements;
  if ((int)CONCAT71(in_register_00000081,isVertexCase) == 0) {
    std::__cxx11::string::assign((char *)&(this->super_ShaderRenderCase).m_fragShaderSource);
    lVar1 = 0xa0;
  }
  else {
    std::__cxx11::string::assign((char *)&(this->super_ShaderRenderCase).m_vertShaderSource);
    lVar1 = 0xc0;
  }
  std::__cxx11::string::assign
            ((char *)((long)&(this->super_ShaderRenderCase).super_TestCase.super_TestNode.
                             _vptr_TestNode + lVar1));
  return;
}

Assistant:

ShaderReturnCase::ShaderReturnCase (Context& context, const char* name, const char* description, bool isVertexCase, const char* shaderSource, ShaderEvalFunc evalFunc, deUint32 requirements)
	: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, description, isVertexCase, evalFunc)
	, m_requirements	(requirements)
{
	if (isVertexCase)
	{
		m_vertShaderSource = shaderSource;
		m_fragShaderSource =
			"varying mediump vec4 v_color;\n\n"
			"void main (void)\n"
			"{\n"
			"    gl_FragColor = v_color;\n"
			"}\n";
	}
	else
	{
		m_fragShaderSource = shaderSource;
		m_vertShaderSource =
			"attribute highp   vec4 a_position;\n"
			"attribute highp   vec4 a_coords;\n"
			"varying   mediump vec4 v_coords;\n\n"
			"void main (void)\n"
			"{\n"
			"    gl_Position = a_position;\n"
			"    v_coords = a_coords;\n"
			"}\n";
	}
}